

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

void duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined1 *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  idx_t count;
  ulong *puVar6;
  unsigned_long *puVar7;
  ValidityMask *count_00;
  anon_union_16_2_67f50693_for_value *paVar8;
  data_ptr_t pdVar9;
  _func_int *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var12;
  undefined4 uVar13;
  undefined4 uVar14;
  byte bVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  undefined1 auVar17 [8];
  SelectionVector *pSVar18;
  SelectionVector *pSVar19;
  bool bVar20;
  reference vector;
  reference vector_00;
  BoundFunctionExpression *pBVar21;
  anon_class_8_1_898d11ac fun;
  TemplatedValidityData<unsigned_long> *pTVar22;
  ValidityMask *pVVar23;
  idx_t iVar24;
  ValidityMask *pVVar25;
  _Head_base<0UL,_unsigned_long_*,_false> _Var26;
  data_ptr_t pdVar27;
  ulong uVar28;
  ValidityMask *pVVar29;
  long lVar30;
  ulong uVar31;
  data_ptr_t pdVar32;
  ValidityMask *in_R9;
  ValidityMask *mask;
  idx_t idx_in_entry;
  ulong uVar33;
  ulong uVar34;
  idx_t iVar35;
  long *plVar36;
  ulong uVar37;
  ulong uVar38;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffec8;
  long *local_118;
  undefined1 local_e8 [8];
  SelectionVector *pSStack_e0;
  ValidityMask *local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_80;
  idx_t local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  pBVar21 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  fun.info = (RegexpMatchesBindData *)
             unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar21->bind_info);
  if (((fun.info)->super_RegexpBaseBindData).constant_pattern == true) {
    local_80.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_80);
    pSVar18 = local_80.sel;
    count = args->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar32 = result->data;
      pdVar9 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar7 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        local_118 = (long *)(pdVar9 + 8);
        iVar35 = 0;
        do {
          local_c8.sel = (SelectionVector *)local_118[-1];
          local_c8.data = (data_ptr_t)*local_118;
          local_80.sel = (SelectionVector *)local_c8.data;
          if ((uint)local_c8.sel < 0xd) {
            local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
          }
          local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
          bVar20 = duckdb_re2::RE2::FullMatchN
                             ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,(Arg **)0x0,0
                             );
          pdVar32[iVar35] = bVar20;
          iVar35 = iVar35 + 1;
          local_118 = local_118 + 2;
        } while (count != iVar35);
        return;
      }
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar38 = 0;
      uVar34 = 0;
      do {
        puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          uVar31 = uVar34 + 0x40;
          if (count <= uVar34 + 0x40) {
            uVar31 = count;
          }
LAB_009e34d9:
          uVar28 = uVar34;
          if (uVar34 < uVar31) {
            plVar36 = (long *)(pdVar9 + uVar34 * 0x10 + 8);
            do {
              local_c8.sel = (SelectionVector *)plVar36[-1];
              local_c8.data = (data_ptr_t)*plVar36;
              local_80.sel = (SelectionVector *)local_c8.data;
              if ((uint)local_c8.sel < 0xd) {
                local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
              }
              local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
              bVar20 = duckdb_re2::RE2::FullMatchN
                                 ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,
                                  (Arg **)0x0,0);
              pdVar32[uVar34] = bVar20;
              uVar34 = uVar34 + 1;
              plVar36 = plVar36 + 2;
              uVar28 = uVar31;
            } while (uVar31 != uVar34);
          }
        }
        else {
          uVar37 = puVar7[uVar38];
          uVar31 = uVar34 + 0x40;
          if (count <= uVar34 + 0x40) {
            uVar31 = count;
          }
          uVar28 = uVar31;
          if (uVar37 != 0) {
            if (uVar37 == 0xffffffffffffffff) goto LAB_009e34d9;
            uVar28 = uVar34;
            if (uVar34 < uVar31) {
              plVar36 = (long *)(pdVar9 + uVar34 * 0x10 + 8);
              uVar33 = 0;
              do {
                if ((uVar37 >> (uVar33 & 0x3f) & 1) != 0) {
                  local_c8.sel = (SelectionVector *)plVar36[-1];
                  local_c8.data = (data_ptr_t)*plVar36;
                  local_80.sel = (SelectionVector *)local_c8.data;
                  if ((uint)local_c8.sel < 0xd) {
                    local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
                  }
                  local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
                  bVar20 = duckdb_re2::RE2::FullMatchN
                                     ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,
                                      (Arg **)0x0,0);
                  pdVar32[uVar33 + uVar34] = bVar20;
                }
                uVar33 = uVar33 + 1;
                plVar36 = plVar36 + 2;
                uVar28 = uVar31;
              } while (uVar31 - uVar34 != uVar33);
            }
          }
        }
        uVar38 = uVar38 + 1;
        uVar34 = uVar28;
        if (uVar38 == count + 0x3f >> 6) {
          return;
        }
      } while( true );
    }
    if (vector->vector_type != CONSTANT_VECTOR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
      Vector::ToUnifiedFormat(vector,count,&local_80);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pSVar19 = local_80.sel;
      pdVar32 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          p_Var10 = (_func_int *)pSVar19->sel_vector;
          iVar35 = 0;
          do {
            iVar24 = iVar35;
            if (p_Var10 != (_func_int *)0x0) {
              iVar24 = (idx_t)*(uint *)(p_Var10 + iVar35 * 4);
            }
            local_e8 = *(undefined1 (*) [8])(local_80.data + iVar24 * 0x10);
            pSStack_e0 = *(SelectionVector **)(local_80.data + iVar24 * 0x10 + 8);
            local_c8.sel = pSStack_e0;
            if (SUB84(local_e8,0) < 0xd) {
              local_c8.sel = (SelectionVector *)(local_e8 + 4);
            }
            local_c8.data = (data_ptr_t)((ulong)local_e8 & 0xffffffff);
            bVar20 = duckdb_re2::RE2::FullMatchN
                               ((StringPiece *)&local_c8,(RE2 *)&pSVar18->selection_data,(Arg **)0x0
                                ,0);
            pdVar32[iVar35] = bVar20;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
      }
      else if (count != 0) {
        p_Var10 = (_func_int *)pSVar19->sel_vector;
        uVar34 = 0;
        do {
          uVar38 = uVar34;
          if (p_Var10 != (_func_int *)0x0) {
            uVar38 = (ulong)*(uint *)(p_Var10 + uVar34 * 4);
          }
          if ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar38 >> 6] >> (uVar38 & 0x3f) & 1) == 0) {
            _Var26._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var26._M_head_impl == (unsigned_long *)0x0) {
              local_e8 = (undefined1  [8])
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long *)local_e8);
              pdVar9 = local_c8.data;
              pSVar19 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar19;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar9;
              if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var26._M_head_impl =
                   (pTVar22->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var26._M_head_impl;
            }
            bVar15 = (byte)uVar34 & 0x3f;
            _Var26._M_head_impl[uVar34 >> 6] =
                 _Var26._M_head_impl[uVar34 >> 6] &
                 (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
          }
          else {
            local_e8 = *(undefined1 (*) [8])(local_80.data + uVar38 * 0x10);
            pSStack_e0 = *(SelectionVector **)(local_80.data + uVar38 * 0x10 + 8);
            local_c8.sel = pSStack_e0;
            if (SUB84(local_e8,0) < 0xd) {
              local_c8.sel = (SelectionVector *)(local_e8 + 4);
            }
            local_c8.data = (data_ptr_t)((ulong)local_e8 & 0xffffffff);
            bVar20 = duckdb_re2::RE2::FullMatchN
                               ((StringPiece *)&local_c8,(RE2 *)&pSVar18->selection_data,(Arg **)0x0
                                ,0);
            pdVar32[uVar34] = bVar20;
          }
          uVar34 = uVar34 + 1;
        } while (count != uVar34);
      }
LAB_009e3f7d:
      if (local_80.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar32 = result->data;
    puVar6 = (ulong *)vector->data;
    puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_c8.sel = (SelectionVector *)*puVar6;
    local_c8.data = (data_ptr_t)puVar6[1];
    local_80.sel = (SelectionVector *)local_c8.data;
    if ((uint)local_c8.sel < 0xd) {
      local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
    }
    local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
    bVar20 = duckdb_re2::RE2::FullMatchN
                       ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,(Arg **)0x0,0);
LAB_009e3813:
    *pdVar32 = bVar20;
    return;
  }
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar32 = result->data;
    if (((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) &&
       ((puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar7 == (unsigned_long *)0x0 || ((*puVar7 & 1) != 0)))) {
      bVar20 = BinaryLambdaWrapper::
               Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                         (fun,(string_t)
                              ((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                          ,in_R9,in_stack_fffffffffffffec8);
      goto LAB_009e3813;
    }
  }
  else {
    count_00 = (ValidityMask *)args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      paVar8 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar32 = vector->data;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar9 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count_00 == (ValidityMask *)0x0) {
            return;
          }
          aVar16 = paVar8->pointer;
          pdVar32 = pdVar32 + 8;
          pVVar29 = (ValidityMask *)0x0;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)pdVar32;
            left_02.value._0_8_ = *(undefined8 *)(pdVar32 + -8);
            bVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                               (fun,left_02,(string_t)aVar16,in_R9,in_stack_fffffffffffffec8);
            pdVar9[(long)pVVar29] = bVar20;
            pVVar29 = (ValidityMask *)
                      ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1);
            pdVar32 = pdVar32 + 0x10;
          } while (count_00 != pVVar29);
          return;
        }
        puVar1 = (undefined1 *)
                 ((long)&count_00[1].super_TemplatedValidityMask<unsigned_long>.capacity + 7);
        if (puVar1 < (undefined1 *)0x40) {
          return;
        }
        uVar34 = 0;
        pVVar29 = (ValidityMask *)0x0;
        do {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar7 == (unsigned_long *)0x0) {
            pVVar23 = pVVar29 + 2;
            if (count_00 <= pVVar29 + 2) {
              pVVar23 = count_00;
            }
LAB_009e335e:
            pVVar25 = pVVar29;
            if (pVVar29 < pVVar23) {
              aVar16 = paVar8->pointer;
              pdVar27 = pdVar32 + (long)pVVar29 * 0x10 + 8;
              do {
                left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                left_00.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                bVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (fun,left_00,(string_t)aVar16,in_R9,in_stack_fffffffffffffec8);
                pdVar9[(long)pVVar29] = bVar20;
                pVVar29 = (ValidityMask *)
                          ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1);
                pdVar27 = pdVar27 + 0x10;
                pVVar25 = pVVar23;
              } while (pVVar23 != pVVar29);
            }
          }
          else {
            uVar38 = puVar7[uVar34];
            pVVar23 = pVVar29 + 2;
            if (count_00 <= pVVar29 + 2) {
              pVVar23 = count_00;
            }
            pVVar25 = pVVar23;
            if (uVar38 != 0) {
              if (uVar38 == 0xffffffffffffffff) goto LAB_009e335e;
              pVVar25 = pVVar29;
              if (pVVar29 < pVVar23) {
                pdVar27 = pdVar32 + (long)pVVar29 * 0x10 + 8;
                uVar31 = 0;
                local_d0 = pVVar23;
                do {
                  if ((uVar38 >> (uVar31 & 0x3f) & 1) != 0) {
                    left.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                    left.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                    bVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (fun,left,(string_t)paVar8->pointer,in_R9,
                                        in_stack_fffffffffffffec8);
                    (pdVar9 + (long)pVVar29)[uVar31] = bVar20;
                  }
                  uVar31 = uVar31 + 1;
                  pdVar27 = pdVar27 + 0x10;
                  pVVar25 = local_d0;
                } while ((long)pVVar23 - (long)pVVar29 != uVar31);
              }
            }
          }
          uVar34 = uVar34 + 1;
          pVVar29 = pVVar25;
          if (uVar34 == (ulong)puVar1 >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar32 = vector->data;
          pdVar9 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,(idx_t)count_00);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count_00 == (ValidityMask *)0x0) {
              return;
            }
            lVar30 = 8;
            pVVar29 = (ValidityMask *)0x0;
            do {
              left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + lVar30);
              left_06.value._0_8_ = *(undefined8 *)(pdVar32 + lVar30 + -8);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar9 + lVar30);
              right_06.value._0_8_ = *(undefined8 *)(pdVar9 + lVar30 + -8);
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_06,right_06,in_R9,in_stack_fffffffffffffec8);
              pdVar27[(long)pVVar29] = bVar20;
              pVVar29 = (ValidityMask *)
                        ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1);
              lVar30 = lVar30 + 0x10;
            } while (count_00 != pVVar29);
            return;
          }
          puVar1 = (undefined1 *)
                   ((long)&count_00[1].super_TemplatedValidityMask<unsigned_long>.capacity + 7);
          if (puVar1 < (undefined1 *)0x40) {
            return;
          }
          uVar34 = 0;
          pVVar29 = (ValidityMask *)0x0;
          do {
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar7 == (unsigned_long *)0x0) {
              pVVar23 = pVVar29 + 2;
              if (count_00 <= pVVar29 + 2) {
                pVVar23 = count_00;
              }
LAB_009e3d32:
              pVVar25 = pVVar29;
              if (pVVar29 < pVVar23) {
                uVar38 = (long)pVVar29 << 4 | 8;
                do {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar38);
                  left_03.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar38 - 8));
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar9 + uVar38);
                  right_02.value._0_8_ = *(undefined8 *)(pdVar9 + (uVar38 - 8));
                  bVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                     (fun,left_03,right_02,in_R9,in_stack_fffffffffffffec8);
                  pdVar27[(long)pVVar29] = bVar20;
                  pVVar29 = (ValidityMask *)
                            ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).
                                    validity_mask + 1);
                  uVar38 = uVar38 + 0x10;
                  pVVar25 = pVVar23;
                } while (pVVar23 != pVVar29);
              }
            }
            else {
              uVar38 = puVar7[uVar34];
              pVVar23 = pVVar29 + 2;
              if (count_00 <= pVVar29 + 2) {
                pVVar23 = count_00;
              }
              pVVar25 = pVVar23;
              if (uVar38 != 0) {
                if (uVar38 == 0xffffffffffffffff) goto LAB_009e3d32;
                pVVar25 = pVVar29;
                if (pVVar29 < pVVar23) {
                  uVar31 = (long)pVVar29 << 4 | 8;
                  uVar37 = 0;
                  do {
                    if ((uVar38 >> (uVar37 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar31);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar31 - 8));
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar9 + uVar31);
                      right_03.value._0_8_ = *(undefined8 *)(pdVar9 + (uVar31 - 8));
                      bVar20 = BinaryLambdaWrapper::
                               Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                         (fun,left_04,right_03,in_R9,in_stack_fffffffffffffec8);
                      (pdVar27 + (long)pVVar29)[uVar37] = bVar20;
                    }
                    uVar37 = uVar37 + 1;
                    uVar31 = uVar31 + 0x10;
                    pVVar25 = pVVar23;
                  } while ((long)pVVar23 - (long)pVVar29 != uVar37);
                }
              }
            }
            uVar34 = uVar34 + 1;
            pVVar29 = pVVar25;
            if (uVar34 == (ulong)puVar1 >> 6) {
              return;
            }
          } while( true );
        }
        UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
        Vector::ToUnifiedFormat(vector,(idx_t)count_00,&local_80);
        Vector::ToUnifiedFormat(vector_00,(idx_t)count_00,&local_c8);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pSVar19 = local_80.sel;
        pdVar9 = local_c8.data;
        pSVar18 = local_c8.sel;
        pdVar32 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count_00 != (ValidityMask *)0x0) {
            p_Var10 = (_func_int *)pSVar19->sel_vector;
            _Var12._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar18->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pVVar29 = (ValidityMask *)0x0;
            do {
              pVVar23 = pVVar29;
              if (p_Var10 != (_func_int *)0x0) {
                pVVar23 = (ValidityMask *)(ulong)*(uint *)(p_Var10 + (long)pVVar29 * 4);
              }
              pVVar25 = pVVar29;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var12._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pVVar25 = (ValidityMask *)
                          (ulong)*(uint *)((long)_Var12._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pVVar29 * 4);
              }
              uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)pdVar9 + pVVar25 * 0x10))->_M_use_count;
              uVar13 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)pdVar9 + pVVar25 * 0x10))->_M_weak_count;
              right.value._12_4_ = uVar13;
              right.value._8_4_ = uVar4;
              left_01.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_80.data + (long)pVVar23 * 0x10 + 8);
              left_01.value._0_8_ = *(undefined8 *)(local_80.data + (long)pVVar23 * 0x10);
              right.value._0_8_ =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pdVar9 + pVVar25 * 0x10))
                   ->_vptr__Sp_counted_base;
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_01,right,in_R9,in_stack_fffffffffffffec8);
              pdVar32[(long)pVVar29] = bVar20;
              pVVar29 = (ValidityMask *)
                        ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1);
            } while (count_00 != pVVar29);
          }
        }
        else if (count_00 != (ValidityMask *)0x0) {
          p_Var10 = (_func_int *)pSVar19->sel_vector;
          _Var12._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)&pSVar18->sel_vector)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          pVVar29 = (ValidityMask *)0x0;
          do {
            pVVar23 = pVVar29;
            if (p_Var10 != (_func_int *)0x0) {
              pVVar23 = (ValidityMask *)(ulong)*(uint *)(p_Var10 + (long)pVVar29 * 4);
            }
            pVVar25 = pVVar29;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var12._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              pVVar25 = (ValidityMask *)
                        (ulong)*(uint *)((long)_Var12._M_t.
                                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                               .super__Head_base<0UL,_unsigned_long_*,_false>.
                                               _M_head_impl + (long)pVVar29 * 4);
            }
            if (((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [(ulong)pVVar23 >> 6] >> ((ulong)pVVar23 & 0x3f) & 1) != 0)) &&
               ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [(ulong)pVVar25 >> 6] >> ((ulong)pVVar25 & 0x3f) & 1) != 0)))) {
              uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)pdVar9 + pVVar25 * 0x10))->_M_use_count;
              uVar14 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)pdVar9 + pVVar25 * 0x10))->_M_weak_count;
              right_04.value._12_4_ = uVar14;
              right_04.value._8_4_ = uVar5;
              left_05.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_80.data + (long)pVVar23 * 0x10 + 8);
              left_05.value._0_8_ = *(undefined8 *)(local_80.data + (long)pVVar23 * 0x10);
              right_04.value._0_8_ =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pdVar9 + pVVar25 * 0x10))
                   ->_vptr__Sp_counted_base;
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_05,right_04,in_R9,in_stack_fffffffffffffec8);
              pdVar32[(long)pVVar29] = bVar20;
            }
            else {
              _Var26._M_head_impl =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var26._M_head_impl == (unsigned_long *)0x0) {
                local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_e8,&local_38);
                pSVar18 = pSStack_e0;
                auVar17 = local_e8;
                local_e8 = (undefined1  [8])0x0;
                pSStack_e0 = (SelectionVector *)0x0;
                p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar17;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar18;
                if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11),
                   pSStack_e0 != (SelectionVector *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_e0);
                }
                pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                _Var26._M_head_impl =
                     (pTVar22->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var26._M_head_impl;
              }
              bVar15 = (byte)pVVar29 & 0x3f;
              _Var26._M_head_impl[(ulong)pVVar29 >> 6] =
                   _Var26._M_head_impl[(ulong)pVVar29 >> 6] &
                   (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            pVVar29 = (ValidityMask *)
                      ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1);
          } while (count_00 != pVVar29);
        }
        if (local_c8.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_009e3f7d;
      }
      paVar8 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar32 = vector_00->data;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar9 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count_00 == (ValidityMask *)0x0) {
            return;
          }
          aVar16 = paVar8->pointer;
          pdVar32 = pdVar32 + 8;
          pVVar29 = (ValidityMask *)0x0;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)pdVar32;
            right_05.value._0_8_ = *(undefined8 *)(pdVar32 + -8);
            bVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                               (fun,(string_t)aVar16,right_05,in_R9,in_stack_fffffffffffffec8);
            pdVar9[(long)pVVar29] = bVar20;
            pVVar29 = (ValidityMask *)
                      ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1);
            pdVar32 = pdVar32 + 0x10;
          } while (count_00 != pVVar29);
          return;
        }
        puVar1 = (undefined1 *)
                 ((long)&count_00[1].super_TemplatedValidityMask<unsigned_long>.capacity + 7);
        if (puVar1 < (undefined1 *)0x40) {
          return;
        }
        pVVar29 = (ValidityMask *)0x0;
        uVar34 = 0;
        do {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar7 == (unsigned_long *)0x0) {
            pVVar23 = pVVar29 + 2;
            if (count_00 <= pVVar29 + 2) {
              pVVar23 = count_00;
            }
LAB_009e3b70:
            pVVar25 = pVVar29;
            if (pVVar29 < pVVar23) {
              aVar16 = paVar8->pointer;
              pdVar27 = pdVar32 + (long)pVVar29 * 0x10 + 8;
              mask = pVVar23;
              do {
                right_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                right_01.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                bVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (fun,(string_t)aVar16,right_01,mask,in_stack_fffffffffffffec8);
                pdVar9[(long)pVVar29] = bVar20;
                pVVar29 = (ValidityMask *)
                          ((long)&(pVVar29->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1);
                pdVar27 = pdVar27 + 0x10;
                pVVar25 = pVVar23;
              } while (pVVar23 != pVVar29);
            }
          }
          else {
            uVar38 = puVar7[uVar34];
            pVVar23 = pVVar29 + 2;
            if (count_00 <= pVVar29 + 2) {
              pVVar23 = count_00;
            }
            pVVar25 = pVVar23;
            if (uVar38 != 0) {
              if (uVar38 == 0xffffffffffffffff) goto LAB_009e3b70;
              uVar31 = (long)pVVar23 - (long)pVVar29;
              pVVar25 = pVVar29;
              if (pVVar29 < pVVar23) {
                pdVar27 = pdVar32 + (long)pVVar29 * 0x10 + 8;
                uVar37 = 0;
                local_d0 = pVVar23;
                do {
                  if ((uVar38 >> (uVar37 & 0x3f) & 1) != 0) {
                    right_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                    right_00.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                    bVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (fun,(string_t)paVar8->pointer,right_00,pVVar23,
                                        in_stack_fffffffffffffec8);
                    (pdVar9 + (long)pVVar29)[uVar37] = bVar20;
                  }
                  uVar37 = uVar37 + 1;
                  pdVar27 = pdVar27 + 0x10;
                  pVVar25 = local_d0;
                } while (uVar31 != uVar37);
              }
            }
          }
          pVVar29 = pVVar25;
          uVar34 = uVar34 + 1;
          if (uVar34 == (ulong)puVar1 >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void RegexpMatchesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &strings = args.data[0];
	auto &patterns = args.data[1];

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RegexpMatchesBindData>();

	if (info.constant_pattern) {
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RegexLocalState>();
		UnaryExecutor::Execute<string_t, bool>(strings, result, args.size(), [&](string_t input) {
			return OP::Operation(CreateStringPiece(input), lstate.constant_pattern);
		});
	} else {
		BinaryExecutor::Execute<string_t, string_t, bool>(strings, patterns, result, args.size(),
		                                                  [&](string_t input, string_t pattern) {
			                                                  RE2 re(CreateStringPiece(pattern), info.options);
			                                                  if (!re.ok()) {
				                                                  throw InvalidInputException(re.error());
			                                                  }
			                                                  return OP::Operation(CreateStringPiece(input), re);
		                                                  });
	}
}